

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O1

string * __thiscall
cmLinkLineDeviceComputer::ComputeLinkLibraries
          (string *__return_storage_ptr__,cmLinkLineDeviceComputer *this,
          cmComputeLinkInformation *cli,string *stdLibString)

{
  pointer pcVar1;
  pointer pIVar2;
  cmGeneratorTarget *pcVar3;
  ulong uVar4;
  char *__s1;
  cmLinkLineComputer *this_00;
  string *psVar5;
  bool bVar6;
  TargetType TVar7;
  int iVar8;
  ItemVector *pIVar9;
  ostream *poVar10;
  size_t len;
  bool bVar11;
  pointer pIVar12;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar13;
  string out;
  string config;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  ostringstream fout;
  string local_290;
  string local_270;
  string local_250;
  cmLinkLineComputer *local_230;
  string *local_228;
  string *local_220;
  long *local_218 [2];
  long local_208 [2];
  string local_1f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  undefined1 local_1a8 [376];
  
  local_230 = &this->super_cmLinkLineComputer;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1d8._M_impl.super__Rb_tree_header._M_header;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
  pIVar9 = cmComputeLinkInformation::GetItems(cli);
  local_218[0] = local_208;
  pcVar1 = (cli->Config)._M_dataplus._M_p;
  local_228 = stdLibString;
  local_220 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_218,pcVar1,pcVar1 + (cli->Config)._M_string_length);
  pIVar12 = (pIVar9->
            super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (pIVar9->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar12 != pIVar2) {
    bVar11 = false;
    do {
      if (bVar11) {
        bVar11 = false;
      }
      else if (pIVar12->Target == (cmGeneratorTarget *)0x0) {
LAB_00304785:
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        local_290._M_string_length = 0;
        local_290.field_2._M_local_buf[0] = '\0';
        if (pIVar12->IsPath == true) {
          uVar4 = (pIVar12->Value)._M_string_length;
          if (((1 < uVar4) &&
              (iVar8 = strcmp((pIVar12->Value)._M_dataplus._M_p + (uVar4 - 2),".a"), iVar8 == 0)) ||
             ((3 < uVar4 &&
              (iVar8 = strcmp((pIVar12->Value)._M_dataplus._M_p + (uVar4 - 4),".lib"), iVar8 == 0)))
             ) {
            this_00 = local_230;
            (*local_230->_vptr_cmLinkLineComputer[2])(&local_1f8,local_230,pIVar12);
            cmLinkLineComputer::ConvertToOutputFormat(&local_270,this_00,&local_1f8);
            std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_270._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p != &local_270.field_2) {
              operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
          }
LAB_003048fc:
          pVar13 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)&local_1d8,&local_290);
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,local_290._M_dataplus._M_p,
                                 local_290._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          }
        }
        else {
          iVar8 = std::__cxx11::string::compare((char *)pIVar12);
          if (iVar8 != 0) {
            __s1 = (pIVar12->Value)._M_dataplus._M_p;
            if ((((*__s1 != '-') || (iVar8 = strncmp(__s1,"-l",2), iVar8 == 0)) ||
                (iVar8 = strncmp(__s1,"-L",2), iVar8 == 0)) ||
               (iVar8 = strncmp(__s1,"--library",9), iVar8 == 0)) {
              std::__cxx11::string::_M_append((char *)&local_290,(ulong)__s1);
            }
            goto LAB_003048fc;
          }
          bVar11 = true;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        TVar7 = cmGeneratorTarget::GetType(pIVar12->Target);
        if (TVar7 == STATIC_LIBRARY) {
          pcVar3 = pIVar12->Target;
          local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_290,"CUDA_RESOLVE_DEVICE_SYMBOLS","");
          bVar6 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&local_290);
          if (bVar6) {
            bVar6 = false;
          }
          else {
            pcVar3 = pIVar12->Target;
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_250,"CUDA_SEPARABLE_COMPILATION","");
            bVar6 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&local_250);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != &local_290.field_2) {
            operator_delete(local_290._M_dataplus._M_p,
                            CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                     local_290.field_2._M_local_buf[0]) + 1);
          }
          if (bVar6 != false) goto LAB_00304785;
        }
      }
      pIVar12 = pIVar12 + 1;
    } while (pIVar12 != pIVar2);
  }
  psVar5 = local_220;
  if (local_228->_M_string_length != 0) {
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(local_228->_M_dataplus)._M_p,
                         local_228->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
  }
  std::__cxx11::stringbuf::str();
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar5;
}

Assistant:

std::string cmLinkLineDeviceComputer::ComputeLinkLibraries(
  cmComputeLinkInformation& cli, std::string const& stdLibString)
{
  // Write the library flags to the build rule.
  std::ostringstream fout;

  // Generate the unique set of link items when device linking.
  // The nvcc device linker is designed so that each static library
  // with device symbols only needs to be listed once as it doesn't
  // care about link order.
  std::set<std::string> emitted;
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  bool skipItemAfterFramework = false;
  for (auto const& item : items) {
    if (skipItemAfterFramework) {
      skipItemAfterFramework = false;
      continue;
    }

    if (item.Target) {
      bool skip = true;
      if (item.Target->GetType() == cmStateEnums::STATIC_LIBRARY) {
        if ((!item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS")) &&
            item.Target->GetPropertyAsBool("CUDA_SEPARABLE_COMPILATION")) {
          skip = false;
        }
      }
      if (skip) {
        continue;
      }
    }

    std::string out;
    if (item.IsPath) {
      // nvcc understands absolute paths to libraries ending in '.a' or '.lib'.
      // These should be passed to nvlink.  Other extensions need to be left
      // out because nvlink may not understand or need them.  Even though it
      // can tolerate '.so' or '.dylib' it cannot tolerate '.so.1'.
      if (cmHasLiteralSuffix(item.Value, ".a") ||
          cmHasLiteralSuffix(item.Value, ".lib")) {
        out += this->ConvertToOutputFormat(
          this->ConvertToLinkReference(item.Value));
      }
    } else if (item.Value == "-framework") {
      // This is the first part of '-framework Name' where the framework
      // name is specified as a following item.  Ignore both.
      skipItemAfterFramework = true;
      continue;
    } else if (cmLinkItemValidForDevice(item.Value)) {
      out += item.Value;
    }

    if (emitted.insert(out).second) {
      fout << out << " ";
    }
  }

  if (!stdLibString.empty()) {
    fout << stdLibString << " ";
  }

  return fout.str();
}